

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O0

bool protobuf_test_messages_proto3_TestAllTypesProto3_optional_bool
               (protobuf_test_messages_proto3_TestAllTypesProto3 *msg)

{
  bool bVar1;
  void *pvVar2;
  undefined1 local_40 [8];
  upb_MiniTableField field;
  bool ret;
  bool default_val;
  protobuf_test_messages_proto3_TestAllTypesProto3 *msg_local;
  
  field.presence._1_1_ = 0;
  local_40._0_4_ = 0xd;
  local_40._4_2_ = 0xb;
  local_40._6_2_ = 0;
  field.number_dont_copy_me__upb_internal_use_only = 0x208ffff;
  pvVar2 = (void *)((long)&field.presence + 1);
  unique0x100000f3 = msg;
  bVar1 = upb_MiniTableField_IsExtension((upb_MiniTableField *)local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  bVar1 = upb_MiniTableField_IsInOneof((upb_MiniTableField *)local_40);
  if (bVar1) {
LAB_001c8e54:
    bVar1 = upb_Message_HasBaseField
                      (&msg->base_dont_copy_me__upb_internal_use_only,(upb_MiniTableField *)local_40
                      );
    if (!bVar1) {
      _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
                ((upb_MiniTableField *)local_40,&field.presence,pvVar2);
      goto LAB_001c8ea5;
    }
  }
  else {
    bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                      ((upb_MiniTableField *)local_40,pvVar2);
    if (!bVar1) goto LAB_001c8e54;
  }
  pvVar2 = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                     (&msg->base_dont_copy_me__upb_internal_use_only,(upb_MiniTableField *)local_40)
  ;
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)local_40,&field.presence,pvVar2);
LAB_001c8ea5:
  return (bool)((byte)field.presence & 1);
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto3_TestAllTypesProto3_optional_bool(const protobuf_test_messages_proto3_TestAllTypesProto3* msg) {
  bool default_val = false;
  bool ret;
  const upb_MiniTableField field = {13, 11, 0, kUpb_NoSub, 8, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_1Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}